

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O2

void __thiscall llama_context::kv_self_update(llama_context *this)

{
  uint uVar1;
  long *plVar2;
  char cVar3;
  bool bVar4;
  int32_t n_max_nodes;
  ggml_cgraph *pgVar5;
  llama_ubatch *ubatch;
  long lVar6;
  pointer *__ptr;
  llama_kv_cache_unified *plVar7;
  bool bVar8;
  undefined1 local_78 [12];
  llama_token token;
  uint32_t local_68;
  uint32_t uStack_64;
  uint local_60;
  uint32_t local_5c;
  llama_token *local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  
  plVar7 = (this->kv_self)._M_t.
           super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
           ._M_t.
           super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
           .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl;
  if (plVar7->has_shift == true) {
    cVar3 = (**(code **)((long)(plVar7->super_llama_kv_cache).super_llama_memory_i + 0x68))();
    if (cVar3 == '\0') {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                 ,0x2ec,"The current context does not support K-shift");
    }
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: applying K-shift\n","kv_self_update");
    bVar8 = (this->model->hparams).rope_type != LLAMA_ROPE_TYPE_NONE;
    if (bVar8) {
      ggml_backend_sched_reset
                ((this->sched)._M_t.
                 super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                 super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                 super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl);
      pgVar5 = graph_init(this);
      build_kv_self_shift((llama_context *)&stack0xffffffffffffff98,(ggml_context *)this,
                          (ggml_cgraph *)
                          (this->ctx_compute)._M_t.
                          super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                          super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                          super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl);
      ggml_backend_sched_alloc_graph
                ((this->sched)._M_t.
                 super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                 super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                 super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl,pgVar5);
      plVar2 = (long *)CONCAT44(uStack_64,local_68);
      (**(code **)(*plVar2 + 0x28))(plVar2,0);
      graph_compute(this,pgVar5,false);
      (**(code **)(*plVar2 + 8))(plVar2);
    }
    plVar7 = (this->kv_self)._M_t.
             super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
             ._M_t.
             super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
             .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl;
    plVar7->has_shift = false;
    uVar1 = plVar7->size;
    for (lVar6 = 0; (ulong)uVar1 << 6 != lVar6; lVar6 = lVar6 + 0x40) {
      *(undefined4 *)
       (*(long *)&(plVar7->cells).super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>.
                  _M_impl.super__Vector_impl_data + 4 + lVar6) = 0;
    }
  }
  else {
    bVar8 = false;
  }
  if (plVar7->do_defrag == true) {
    llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: defragmenting KV cache\n","kv_self_update");
    plVar7 = (this->kv_self)._M_t.
             super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
             ._M_t.
             super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
             .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl;
    n_max_nodes = graph_max_nodes(this);
    bVar4 = llama_kv_cache_unified::defrag_prepare(plVar7,n_max_nodes);
    if (bVar4) {
      ggml_backend_sched_reset
                ((this->sched)._M_t.
                 super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                 super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                 super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl);
      pgVar5 = graph_init(this);
      build_kv_self_defrag
                ((llama_context *)&stack0xffffffffffffff98,(ggml_context *)this,
                 (ggml_cgraph *)
                 (this->ctx_compute)._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
                 _M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                 super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl);
      ggml_backend_sched_alloc_graph
                ((this->sched)._M_t.
                 super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                 super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                 super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl,pgVar5);
      plVar2 = (long *)CONCAT44(uStack_64,local_68);
      (**(code **)(*plVar2 + 0x28))(plVar2,0);
      graph_compute(this,pgVar5,false);
      (**(code **)(*plVar2 + 8))(plVar2);
      ((this->kv_self)._M_t.
       super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>.
       _M_t.
       super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
       .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl)->do_defrag = false;
      goto LAB_001d2af2;
    }
    ((this->kv_self)._M_t.
     super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>.
     _M_t.
     super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>.
     super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl)->do_defrag = false;
  }
  if (!bVar8) {
    return;
  }
LAB_001d2af2:
  llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: reserving a worst case graph\n","kv_self_update");
  uStack_64 = (this->cparams).n_ctx;
  uVar1 = (this->cparams).n_ubatch;
  if (uVar1 < uStack_64) {
    uStack_64 = uVar1;
  }
  plVar7 = (this->kv_self)._M_t.
           super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
           ._M_t.
           super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
           .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl;
  plVar7->n = plVar7->size;
  token = llama_vocab::token_bos(&this->model->vocab);
  local_58 = &token;
  local_68 = CONCAT31(local_68._1_3_,1);
  local_5c = 1;
  local_50._0_4_ = 0;
  local_50._4_4_ = 0;
  uStack_48._0_4_ = 0.0;
  uStack_48._4_4_ = 0.0;
  local_40._0_4_ = 0;
  local_40._4_4_ = 0.0;
  uStack_38._0_4_ = 0.0;
  uStack_38._4_4_ = 0.0;
  local_30._0_4_ = 0.0;
  local_30._4_4_ = 0.0;
  local_60 = uStack_64;
  ubatch = (llama_ubatch *)graph_init(this);
  graph_build((llama_context *)local_78,(ggml_context *)this,
              (ggml_cgraph *)
              (this->ctx_compute)._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
              _M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,ubatch,
              (llm_graph_type)&stack0xffffffffffffff98);
  if ((llama_model *)local_78._0_8_ != (llama_model *)0x0) {
    (**(code **)(*(long *)local_78._0_8_ + 8))();
  }
  local_78._0_8_ = (llama_model *)0x0;
  ggml_backend_sched_reset
            ((this->sched)._M_t.
             super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
             super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
             super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl);
  cVar3 = ggml_backend_sched_reserve
                    ((this->sched)._M_t.
                     super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                     super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                     super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl,ubatch);
  if (cVar3 == '\0') {
    llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to allocate compute buffers\n",
                       "kv_self_update");
  }
  return;
}

Assistant:

void llama_context::kv_self_update() {
    auto & kv = kv_self;

    bool need_reserve = false;

    if (kv->has_shift) {
        if (!kv->get_can_shift()) {
            GGML_ABORT("The current context does not support K-shift");
        }

        LLAMA_LOG_DEBUG("%s: applying K-shift\n", __func__);

        // apply K-shift if needed
        if (model.hparams.rope_type != LLAMA_ROPE_TYPE_NONE) {
            ggml_backend_sched_reset(sched.get());

            auto * gf = graph_init();

            auto res = build_kv_self_shift(ctx_compute.get(), gf);

            ggml_backend_sched_alloc_graph(sched.get(), gf);

            res->set_inputs(nullptr);

            graph_compute(gf, false);

            need_reserve = true;
        }

        {
            kv->has_shift = false;

            for (uint32_t i = 0; i < kv->size; ++i) {
                kv->cells[i].delta = 0;
            }
        }
    }

    // defragment the KV cache if needed
    if (kv->do_defrag) {
        LLAMA_LOG_DEBUG("%s: defragmenting KV cache\n", __func__);

        if (kv->defrag_prepare(graph_max_nodes())) {
            ggml_backend_sched_reset(sched.get());

            auto * gf = graph_init();

            auto res = build_kv_self_defrag(ctx_compute.get(), gf);

            ggml_backend_sched_alloc_graph(sched.get(), gf);

            res->set_inputs(nullptr);

            graph_compute(gf, false);

            need_reserve = true;
        }

        kv->do_defrag = false;
    }

    // reserve a worst case graph if needed
    if (need_reserve) {
        LLAMA_LOG_DEBUG("%s: reserving a worst case graph\n", __func__);

        // build worst-case graph
        uint32_t n_seqs = 1; // TODO: worst-case number of sequences
        uint32_t n_tokens = std::min(cparams.n_ctx, cparams.n_ubatch);

        // simulate full KV cache
        kv_self->n = kv_self->size;

        llama_token token = model.vocab.token_bos(); // not actually used by llama_build_graph, but required to choose between token and embedding inputs graph
        llama_ubatch ubatch = { true, n_tokens, n_tokens / n_seqs, n_seqs, &token, nullptr, nullptr, nullptr, nullptr, nullptr};

        auto * gf = graph_init();
        graph_build(ctx_compute.get(), gf, ubatch, LLM_GRAPH_TYPE_DEFAULT);

        // initialize scheduler with the worst-case graph
        ggml_backend_sched_reset(sched.get());
        if (!ggml_backend_sched_reserve(sched.get(), gf)) {
            LLAMA_LOG_ERROR("%s: failed to allocate compute buffers\n", __func__);
        }
    }
}